

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

void __thiscall DPolyAction::Destroy(DPolyAction *this)

{
  DPolyAction *pDVar1;
  DInterpolation *this_00;
  FPolyObj *pFVar2;
  long lVar3;
  
  lVar3 = (long)po_NumPolyobjs;
  if (0 < lVar3) {
    pFVar2 = polyobjs;
    do {
      if (pFVar2->tag == this->m_PolyObj) goto LAB_0046e863;
      pFVar2 = pFVar2 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  pFVar2 = (FPolyObj *)0x0;
LAB_0046e863:
  pDVar1 = (pFVar2->specialdata).field_0.p;
  if ((pDVar1 != (DPolyAction *)0x0) &&
     (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 || pDVar1 == this)) {
    (pFVar2->specialdata).field_0.p = (DPolyAction *)0x0;
  }
  this_00 = (this->m_Interpolation).field_0.p;
  if (this_00 != (DInterpolation *)0x0) {
    if (((this_00->super_DObject).ObjectFlags & 0x20) == 0) {
      DInterpolation::DelRef(this_00,false);
    }
    (this->m_Interpolation).field_0.p = (DInterpolation *)0x0;
  }
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DPolyAction::Destroy()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly->specialdata == this)
	{
		poly->specialdata = NULL;
	}

	StopInterpolation();
	Super::Destroy();
}